

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O0

BOOL compare_opcodes(PCRE2_SPTR8 code,BOOL utf,BOOL ucp,compile_block_8 *cb,uint32_t *base_list,
                    PCRE2_SPTR8 base_end,int *rec_limit)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  BOOL BVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  bool bVar7;
  byte *local_118;
  byte *local_e8;
  uint local_dc;
  uint32_t rightop;
  uint32_t leftop;
  PCRE2_SPTR8 bracode;
  BOOL entered_a_group;
  BOOL invert_bits;
  BOOL accepted;
  uint32_t chr;
  uint8_t *set_end;
  uint8_t *set2;
  uint8_t *set1;
  uint8_t *class_bitset;
  PCRE2_SPTR8 next_code;
  uint32_t *list_ptr;
  uint32_t *ochr_ptr;
  uint32_t *chr_ptr;
  uint32_t list [8];
  byte local_39;
  PCRE2_UCHAR8 c;
  PCRE2_SPTR8 base_end_local;
  uint32_t *base_list_local;
  compile_block_8 *cb_local;
  BOOL ucp_local;
  BOOL utf_local;
  PCRE2_SPTR8 code_local;
  
  bVar2 = 0;
  iVar1 = *rec_limit;
  *rec_limit = iVar1 + -1;
  _ucp_local = code;
  if (iVar1 + -1 < 1) {
    return 0;
  }
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              for (; local_39 = *_ucp_local, local_39 == 0x76; _ucp_local = _ucp_local + 6) {
              }
              if (local_39 != 0x77) break;
              _ucp_local = _ucp_local + CONCAT11(_ucp_local[5],_ucp_local[6]);
            }
            if (local_39 == 0x78) {
              do {
                _ucp_local = _ucp_local + CONCAT11(_ucp_local[1],_ucp_local[2]);
              } while (*_ucp_local == 0x78);
              local_39 = *_ucp_local;
            }
            uVar3 = (uint)local_39;
            if (uVar3 == 0) {
              return (uint)(base_list[1] != 0);
            }
            if ((uVar3 != 0x79) && (uVar3 != 0x7c)) break;
            if (base_list[1] == 0) {
              return 0;
            }
            switch(_ucp_local
                   [-(ulong)(ushort)(*(ushort *)(_ucp_local + 1) << 8 |
                                    *(ushort *)(_ucp_local + 1) >> 8)]) {
            case 0x7f:
            case 0x80:
            case 0x85:
              return (uint)((bVar2 ^ 0xff) & 1);
            case 0x81:
            case 0x82:
              if ((_ucp_local +
                  -(ulong)(ushort)(*(ushort *)(_ucp_local + 1) << 8 |
                                  *(ushort *)(_ucp_local + 1) >> 8))[3] == 0x7e) {
                local_dc = 0;
              }
              else {
                local_dc = (uint)((bVar2 ^ 0xff) & 1);
              }
              return local_dc;
            case 0x83:
            case 0x84:
              return 0;
            case 0x86:
              if ((*base_list != 0x1d) && (*base_list != 0x1e)) {
                return 0;
              }
              break;
            case 0x89:
            case 0x8a:
            case 0x8e:
            case 0x8f:
              if (cb->had_recurse != 0) {
                return 0;
              }
            }
            _ucp_local = _ucp_local +
                         (int)(uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                                    [local_39];
          }
          if ((uVar3 != 0x85) && ((uVar3 != 0x87 && (uVar3 != 0x89)))) break;
          class_bitset = _ucp_local + CONCAT11(_ucp_local[1],_ucp_local[2]);
          _ucp_local = _ucp_local +
                       (int)(uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                                  [local_39];
          for (; *class_bitset == 'x';
              class_bitset = class_bitset + CONCAT11(class_bitset[1],class_bitset[2])) {
            BVar4 = compare_opcodes(_ucp_local,utf,ucp,cb,base_list,base_end,rec_limit);
            if (BVar4 == 0) {
              return 0;
            }
            _ucp_local = class_bitset + 3;
          }
          bVar2 = 1;
        }
        if (1 < uVar3 - 0x97) break;
        class_bitset = _ucp_local + 1;
        if (((*class_bitset != 0x87) && (*class_bitset != 0x89)) && (*class_bitset != 0x85)) {
          return 0;
        }
        do {
          class_bitset = class_bitset + CONCAT11(class_bitset[1],class_bitset[2]);
        } while (*class_bitset == 'x');
        BVar4 = compare_opcodes(class_bitset + 3,utf,ucp,cb,base_list,base_end,rec_limit);
        if (BVar4 == 0) {
          return 0;
        }
        _ucp_local = _ucp_local +
                     (int)(uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                                [local_39];
      }
      _ucp_local = get_chr_property_list(_ucp_local,utf,ucp,cb->fcc,(uint32_t *)&chr_ptr);
      if (_ucp_local == (byte *)0x0) {
        return 0;
      }
      if (*base_list != 0x1d) break;
      ochr_ptr = base_list + 2;
      next_code = (PCRE2_SPTR8)&chr_ptr;
LAB_001db305:
      do {
        uVar3 = *ochr_ptr;
        switch(*(undefined4 *)next_code) {
        case 6:
          if ((0xff < uVar3) || ((cb->ctypes[uVar3] & 8) == 0)) {
            return 0;
          }
          break;
        case 7:
          if ((uVar3 < 0x100) && ((cb->ctypes[uVar3] & 8) != 0)) {
            return 0;
          }
          break;
        case 8:
          if ((0xff < uVar3) || ((cb->ctypes[uVar3] & 1) == 0)) {
            return 0;
          }
          break;
        case 9:
          if ((uVar3 < 0x100) && ((cb->ctypes[uVar3] & 1) != 0)) {
            return 0;
          }
          break;
        case 10:
          if ((0xff < uVar3) || ((cb->ctypes[uVar3] & 0x10) == 0)) {
            return 0;
          }
          break;
        case 0xb:
          if ((uVar3 < 0xff) && ((cb->ctypes[uVar3] & 0x10) != 0)) {
            return 0;
          }
          break;
        default:
          return 0;
        case 0x11:
        case 0x15:
          if (((uVar3 - 10 < 4) || (uVar3 == 0x85)) || (uVar3 == 0x2028 || uVar3 == 0x2029)) {
            return 0;
          }
          break;
        case 0x12:
          if (((uVar3 != 9) && (uVar3 != 0x20)) &&
             ((((uVar3 != 0xa0 && ((uVar3 != 0x1680 && (uVar3 != 0x180e)))) && (10 < uVar3 - 0x2000)
               ) && (((uVar3 != 0x202f && (uVar3 != 0x205f)) && (uVar3 != 0x3000)))))) {
            return 0;
          }
          break;
        case 0x13:
          if ((((uVar3 == 9) || (uVar3 == 0x20)) ||
              ((uVar3 == 0xa0 || ((uVar3 == 0x1680 || (uVar3 == 0x180e)))))) ||
             ((uVar3 - 0x2000 < 0xb ||
              (((uVar3 == 0x202f || (uVar3 == 0x205f)) || (uVar3 == 0x3000)))))) {
            return 0;
          }
          break;
        case 0x14:
          if (((3 < uVar3 - 10) && (uVar3 != 0x85)) && (uVar3 != 0x2028 && uVar3 != 0x2029)) {
            return 0;
          }
          break;
        case 0x17:
        case 0x19:
          if (((uVar3 - 10 < 4) || (uVar3 == 0x85)) || (uVar3 == 0x2028 || uVar3 == 0x2029)) {
            return 0;
          }
          break;
        case 0x18:
          break;
        case 0x1d:
          list_ptr = (uint32_t *)(next_code + 8);
          do {
            if (uVar3 == *list_ptr) {
              return 0;
            }
            list_ptr = list_ptr + 1;
          } while (*list_ptr != 0xffffffff);
          break;
        case 0x1f:
          list_ptr = (uint32_t *)(next_code + 8);
          do {
            if (uVar3 == *list_ptr) break;
            list_ptr = list_ptr + 1;
          } while (*list_ptr != 0xffffffff);
          if (*list_ptr == 0xffffffff) {
            return 0;
          }
          break;
        case 0x6f:
          if (0xff < uVar3) {
            return 0;
          }
        case 0x6e:
          if (uVar3 < 0x100) {
            local_118 = base_end;
            if ((uint32_t **)next_code == &chr_ptr) {
              local_118 = _ucp_local;
            }
            if (((uint)local_118[(ulong)(uVar3 >> 3) - (ulong)*(uint *)(next_code + 8)] &
                1 << ((byte)uVar3 & 7)) != 0) {
              return 0;
            }
          }
        }
        ochr_ptr = ochr_ptr + 1;
      } while (*ochr_ptr != 0xffffffff);
      if (chr_ptr._4_4_ == 0) {
        return 1;
      }
    }
    next_code = (PCRE2_SPTR8)base_list;
    if ((uint)chr_ptr == 0x1d) {
      ochr_ptr = list;
      goto LAB_001db305;
    }
    if (((*base_list == 0x6e) || ((uint)chr_ptr == 0x6e)) ||
       ((utf == 0 && ((*base_list == 0x6f || ((uint)chr_ptr == 0x6f)))))) {
      if ((*base_list == 0x6e) || ((utf == 0 && (*base_list == 0x6f)))) {
        set2 = base_end + -(ulong)base_list[2];
        next_code = (PCRE2_SPTR8)&chr_ptr;
      }
      else {
        set2 = _ucp_local + -(ulong)list[0];
      }
      bVar7 = false;
      iVar1 = *(int *)next_code;
      if (iVar1 == 6) {
        bVar7 = true;
LAB_001db0f1:
        set_end = cb->cbits + 0x40;
      }
      else {
        if (iVar1 == 7) goto LAB_001db0f1;
        if (iVar1 == 8) {
          bVar7 = true;
LAB_001db110:
          set_end = cb->cbits;
        }
        else {
          if (iVar1 == 9) goto LAB_001db110;
          if (iVar1 == 10) {
            bVar7 = true;
LAB_001db12b:
            set_end = cb->cbits + 0xa0;
          }
          else {
            if (iVar1 == 0xb) goto LAB_001db12b;
            if (iVar1 != 0x6e && iVar1 != 0x6f) {
              return 0;
            }
            local_e8 = base_end;
            if ((uint32_t **)next_code == &chr_ptr) {
              local_e8 = _ucp_local;
            }
            set_end = local_e8 + -(ulong)*(uint *)(next_code + 8);
          }
        }
      }
      puVar5 = set2 + 0x20;
      if (bVar7) {
        do {
          puVar6 = set2 + 1;
          if ((*set2 & (*set_end ^ 0xff)) != 0) {
            return 0;
          }
          set_end = set_end + 1;
          set2 = puVar6;
        } while (puVar6 < puVar5);
      }
      else {
        do {
          puVar6 = set2 + 1;
          if ((*set2 & *set_end) != 0) {
            return 0;
          }
          set_end = set_end + 1;
          set2 = puVar6;
        } while (puVar6 < puVar5);
      }
      if (chr_ptr._4_4_ == 0) {
        return 1;
      }
    }
    else {
      uVar3 = *base_list;
      bVar7 = false;
      if ((5 < uVar3) &&
         (((bVar7 = false, uVar3 < 0x17 && (bVar7 = false, 5 < (uint)chr_ptr)) &&
          (bVar7 = false, (uint)chr_ptr < 0x1b)))) {
        bVar7 = autoposstab[uVar3 - 6][(uint)chr_ptr - 6] != '\0';
      }
      if (!bVar7) {
        return 0;
      }
      if (chr_ptr._4_4_ == 0) {
        return 1;
      }
    }
  } while( true );
}

Assistant:

static BOOL
compare_opcodes(PCRE2_SPTR code, BOOL utf, BOOL ucp, const compile_block *cb,
  const uint32_t *base_list, PCRE2_SPTR base_end, int *rec_limit)
{
PCRE2_UCHAR c;
uint32_t list[8];
const uint32_t *chr_ptr;
const uint32_t *ochr_ptr;
const uint32_t *list_ptr;
PCRE2_SPTR next_code;
#ifdef SUPPORT_WIDE_CHARS
PCRE2_SPTR xclass_flags;
#endif
const uint8_t *class_bitset;
const uint8_t *set1, *set2, *set_end;
uint32_t chr;
BOOL accepted, invert_bits;
BOOL entered_a_group = FALSE;

if (--(*rec_limit) <= 0) return FALSE;  /* Recursion has gone too deep */

/* Note: the base_list[1] contains whether the current opcode has a greedy
(represented by a non-zero value) quantifier. This is a different from
other character type lists, which store here that the character iterator
matches to an empty string (also represented by a non-zero value). */

for(;;)
  {
  PCRE2_SPTR bracode;

  /* All operations move the code pointer forward.
  Therefore infinite recursions are not possible. */

  c = *code;

  /* Skip over callouts */

  if (c == OP_CALLOUT)
    {
    code += PRIV(OP_lengths)[c];
    continue;
    }

  if (c == OP_CALLOUT_STR)
    {
    code += GET(code, 1 + 2*LINK_SIZE);
    continue;
    }

  /* At the end of a branch, skip to the end of the group. */

  if (c == OP_ALT)
    {
    do code += GET(code, 1); while (*code == OP_ALT);
    c = *code;
    }

  /* Inspect the next opcode. */

  switch(c)
    {
    /* We can always possessify a greedy iterator at the end of the pattern,
    which is reached after skipping over the final OP_KET. A non-greedy
    iterator must never be possessified. */

    case OP_END:
    return base_list[1] != 0;

    /* When an iterator is at the end of certain kinds of group we can inspect
    what follows the group by skipping over the closing ket. Note that this
    does not apply to OP_KETRMAX or OP_KETRMIN because what follows any given
    iteration is variable (could be another iteration or could be the next
    item). As these two opcodes are not listed in the next switch, they will
    end up as the next code to inspect, and return FALSE by virtue of being
    unsupported. */

    case OP_KET:
    case OP_KETRPOS:
    /* The non-greedy case cannot be converted to a possessive form. */

    if (base_list[1] == 0) return FALSE;

    /* If the bracket is capturing it might be referenced by an OP_RECURSE
    so its last iterator can never be possessified if the pattern contains
    recursions. (This could be improved by keeping a list of group numbers that
    are called by recursion.) */

    bracode = code - GET(code, 1);
    switch(*bracode)
      {
      case OP_CBRA:
      case OP_SCBRA:
      case OP_CBRAPOS:
      case OP_SCBRAPOS:
      if (cb->had_recurse) return FALSE;
      break;

      /* A script run might have to backtrack if the iterated item can match
      characters from more than one script. So give up unless repeating an
      explicit character. */

      case OP_SCRIPT_RUN:
      if (base_list[0] != OP_CHAR && base_list[0] != OP_CHARI)
        return FALSE;
      break;

      /* Atomic sub-patterns and assertions can always auto-possessify their
      last iterator except for variable length lookbehinds. However, if the
      group was entered as a result of checking a previous iterator, this is
      not possible. */

      case OP_ASSERT:
      case OP_ASSERT_NOT:
      case OP_ONCE:
      return !entered_a_group;

      case OP_ASSERTBACK:
      case OP_ASSERTBACK_NOT:
      return (bracode[1+LINK_SIZE] == OP_VREVERSE)? FALSE : !entered_a_group;

      /* Non-atomic assertions - don't possessify last iterator. This needs
      more thought. */

      case OP_ASSERT_NA:
      case OP_ASSERTBACK_NA:
      return FALSE;
      }

    /* Skip over the bracket and inspect what comes next. */

    code += PRIV(OP_lengths)[c];
    continue;

    /* Handle cases where the next item is a group. */

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    next_code = code + GET(code, 1);
    code += PRIV(OP_lengths)[c];

    /* Check each branch. We have to recurse a level for all but the last
    branch. */

    while (*next_code == OP_ALT)
      {
      if (!compare_opcodes(code, utf, ucp, cb, base_list, base_end, rec_limit))
        return FALSE;
      code = next_code + 1 + LINK_SIZE;
      next_code += GET(next_code, 1);
      }

    entered_a_group = TRUE;
    continue;

    case OP_BRAZERO:
    case OP_BRAMINZERO:

    next_code = code + 1;
    if (*next_code != OP_BRA && *next_code != OP_CBRA &&
        *next_code != OP_ONCE) return FALSE;

    do next_code += GET(next_code, 1); while (*next_code == OP_ALT);

    /* The bracket content will be checked by the OP_BRA/OP_CBRA case above. */

    next_code += 1 + LINK_SIZE;
    if (!compare_opcodes(next_code, utf, ucp, cb, base_list, base_end,
         rec_limit))
      return FALSE;

    code += PRIV(OP_lengths)[c];
    continue;

    /* The next opcode does not need special handling; fall through and use it
    to see if the base can be possessified. */

    default:
    break;
    }

  /* We now have the next appropriate opcode to compare with the base. Check
  for a supported opcode, and load its properties. */

  code = get_chr_property_list(code, utf, ucp, cb->fcc, list);
  if (code == NULL) return FALSE;    /* Unsupported */

  /* If either opcode is a small character list, set pointers for comparing
  characters from that list with another list, or with a property. */

  if (base_list[0] == OP_CHAR)
    {
    chr_ptr = base_list + 2;
    list_ptr = list;
    }
  else if (list[0] == OP_CHAR)
    {
    chr_ptr = list + 2;
    list_ptr = base_list;
    }

  /* Character bitsets can also be compared to certain opcodes. */

  else if (base_list[0] == OP_CLASS || list[0] == OP_CLASS
#if PCRE2_CODE_UNIT_WIDTH == 8
      /* In 8 bit, non-UTF mode, OP_CLASS and OP_NCLASS are the same. */
      || (!utf && (base_list[0] == OP_NCLASS || list[0] == OP_NCLASS))
#endif
      )
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    if (base_list[0] == OP_CLASS || (!utf && base_list[0] == OP_NCLASS))
#else
    if (base_list[0] == OP_CLASS)
#endif
      {
      set1 = (uint8_t *)(base_end - base_list[2]);
      list_ptr = list;
      }
    else
      {
      set1 = (uint8_t *)(code - list[2]);
      list_ptr = base_list;
      }

    invert_bits = FALSE;
    switch(list_ptr[0])
      {
      case OP_CLASS:
      case OP_NCLASS:
      set2 = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      xclass_flags = (list_ptr == list ? code : base_end) - list_ptr[2] + LINK_SIZE;
      if ((*xclass_flags & XCL_HASPROP) != 0) return FALSE;
      if ((*xclass_flags & XCL_MAP) == 0)
        {
        /* No bits are set for characters < 256. */
        if (list[1] == 0) return (*xclass_flags & XCL_NOT) == 0;
        /* Might be an empty repeat. */
        continue;
        }
      set2 = (uint8_t *)(xclass_flags + 1);
      break;
#endif

      case OP_NOT_DIGIT:
      invert_bits = TRUE;
      /* Fall through */
      case OP_DIGIT:
      set2 = (uint8_t *)(cb->cbits + cbit_digit);
      break;

      case OP_NOT_WHITESPACE:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WHITESPACE:
      set2 = (uint8_t *)(cb->cbits + cbit_space);
      break;

      case OP_NOT_WORDCHAR:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WORDCHAR:
      set2 = (uint8_t *)(cb->cbits + cbit_word);
      break;

      default:
      return FALSE;
      }

    /* Because the bit sets are unaligned bytes, we need to perform byte
    comparison here. */

    set_end = set1 + 32;
    if (invert_bits)
      {
      do
        {
        if ((*set1++ & ~(*set2++)) != 0) return FALSE;
        }
      while (set1 < set_end);
      }
    else
      {
      do
        {
        if ((*set1++ & *set2++) != 0) return FALSE;
        }
      while (set1 < set_end);
      }

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Some property combinations also acceptable. Unicode property opcodes are
  processed specially; the rest can be handled with a lookup table. */

  else
    {
    uint32_t leftop, rightop;

    leftop = base_list[0];
    rightop = list[0];

#ifdef SUPPORT_UNICODE
    accepted = FALSE; /* Always set in non-unicode case. */
    if (leftop == OP_PROP || leftop == OP_NOTPROP)
      {
      if (rightop == OP_EOD)
        accepted = TRUE;
      else if (rightop == OP_PROP || rightop == OP_NOTPROP)
        {
        int n;
        const uint8_t *p;
        BOOL same = leftop == rightop;
        BOOL lisprop = leftop == OP_PROP;
        BOOL risprop = rightop == OP_PROP;
        BOOL bothprop = lisprop && risprop;

        /* There's a table that specifies how each combination is to be
        processed:
          0   Always return FALSE (never auto-possessify)
          1   Character groups are distinct (possessify if both are OP_PROP)
          2   Check character categories in the same group (general or particular)
          3   Return TRUE if the two opcodes are not the same
          ... see comments below
        */

        n = propposstab[base_list[2]][list[2]];
        switch(n)
          {
          case 0: break;
          case 1: accepted = bothprop; break;
          case 2: accepted = (base_list[3] == list[3]) != same; break;
          case 3: accepted = !same; break;

          case 4:  /* Left general category, right particular category */
          accepted = risprop && catposstab[base_list[3]][list[3]] == same;
          break;

          case 5:  /* Right general category, left particular category */
          accepted = lisprop && catposstab[list[3]][base_list[3]] == same;
          break;

          /* This code is logically tricky. Think hard before fiddling with it.
          The posspropstab table has four entries per row. Each row relates to
          one of PCRE's special properties such as ALNUM or SPACE or WORD.
          Only WORD actually needs all four entries, but using repeats for the
          others means they can all use the same code below.

          The first two entries in each row are Unicode general categories, and
          apply always, because all the characters they include are part of the
          PCRE character set. The third and fourth entries are a general and a
          particular category, respectively, that include one or more relevant
          characters. One or the other is used, depending on whether the check
          is for a general or a particular category. However, in both cases the
          category contains more characters than the specials that are defined
          for the property being tested against. Therefore, it cannot be used
          in a NOTPROP case.

          Example: the row for WORD contains ucp_L, ucp_N, ucp_P, ucp_Po.
          Underscore is covered by ucp_P or ucp_Po. */

          case 6:  /* Left alphanum vs right general category */
          case 7:  /* Left space vs right general category */
          case 8:  /* Left word vs right general category */
          p = posspropstab[n-6];
          accepted = risprop && lisprop ==
            (list[3] != p[0] &&
             list[3] != p[1] &&
            (list[3] != p[2] || !lisprop));
          break;

          case 9:   /* Right alphanum vs left general category */
          case 10:  /* Right space vs left general category */
          case 11:  /* Right word vs left general category */
          p = posspropstab[n-9];
          accepted = lisprop && risprop ==
            (base_list[3] != p[0] &&
             base_list[3] != p[1] &&
            (base_list[3] != p[2] || !risprop));
          break;

          case 12:  /* Left alphanum vs right particular category */
          case 13:  /* Left space vs right particular category */
          case 14:  /* Left word vs right particular category */
          p = posspropstab[n-12];
          accepted = risprop && lisprop ==
            (catposstab[p[0]][list[3]] &&
             catposstab[p[1]][list[3]] &&
            (list[3] != p[3] || !lisprop));
          break;

          case 15:  /* Right alphanum vs left particular category */
          case 16:  /* Right space vs left particular category */
          case 17:  /* Right word vs left particular category */
          p = posspropstab[n-15];
          accepted = lisprop && risprop ==
            (catposstab[p[0]][base_list[3]] &&
             catposstab[p[1]][base_list[3]] &&
            (base_list[3] != p[3] || !risprop));
          break;
          }
        }
      }

    else
#endif  /* SUPPORT_UNICODE */

    accepted = leftop >= FIRST_AUTOTAB_OP && leftop <= LAST_AUTOTAB_LEFT_OP &&
           rightop >= FIRST_AUTOTAB_OP && rightop <= LAST_AUTOTAB_RIGHT_OP &&
           autoposstab[leftop - FIRST_AUTOTAB_OP][rightop - FIRST_AUTOTAB_OP];

    if (!accepted) return FALSE;

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Control reaches here only if one of the items is a small character list.
  All characters are checked against the other side. */

  do
    {
    chr = *chr_ptr;

    switch(list_ptr[0])
      {
      case OP_CHAR:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr) return FALSE;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      break;

      case OP_NOT:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr)
          break;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      if (*ochr_ptr == NOTACHAR) return FALSE;   /* Not found */
      break;

      /* Note that OP_DIGIT etc. are generated only when PCRE2_UCP is *not*
      set. When it is set, \d etc. are converted into OP_(NOT_)PROP codes. */

      case OP_DIGIT:
      if (chr < 256 && (cb->ctypes[chr] & ctype_digit) != 0) return FALSE;
      break;

      case OP_NOT_DIGIT:
      if (chr > 255 || (cb->ctypes[chr] & ctype_digit) == 0) return FALSE;
      break;

      case OP_WHITESPACE:
      if (chr < 256 && (cb->ctypes[chr] & ctype_space) != 0) return FALSE;
      break;

      case OP_NOT_WHITESPACE:
      if (chr > 255 || (cb->ctypes[chr] & ctype_space) == 0) return FALSE;
      break;

      case OP_WORDCHAR:
      if (chr < 255 && (cb->ctypes[chr] & ctype_word) != 0) return FALSE;
      break;

      case OP_NOT_WORDCHAR:
      if (chr > 255 || (cb->ctypes[chr] & ctype_word) == 0) return FALSE;
      break;

      case OP_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_ANYNL:
      case OP_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_DOLL:
      case OP_EODN:
      switch (chr)
        {
        case CHAR_CR:
        case CHAR_LF:
        case CHAR_VT:
        case CHAR_FF:
        case CHAR_NEL:
#ifndef EBCDIC
        case 0x2028:
        case 0x2029:
#endif  /* Not EBCDIC */
        return FALSE;
        }
      break;

      case OP_EOD:    /* Can always possessify before \z */
      break;

#ifdef SUPPORT_UNICODE
      case OP_PROP:
      case OP_NOTPROP:
      if (!check_char_prop(chr, list_ptr[2], list_ptr[3],
            list_ptr[0] == OP_NOTPROP))
        return FALSE;
      break;
#endif

      case OP_NCLASS:
      if (chr > 255) return FALSE;
      /* Fall through */

      case OP_CLASS:
      if (chr > 255) break;
      class_bitset = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      if ((class_bitset[chr >> 3] & (1u << (chr & 7))) != 0) return FALSE;
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      if (PRIV(xclass)(chr, (list_ptr == list ? code : base_end) -
          list_ptr[2] + LINK_SIZE, utf)) return FALSE;
      break;
#endif

      default:
      return FALSE;
      }

    chr_ptr++;
    }
  while(*chr_ptr != NOTACHAR);

  /* At least one character must be matched from this opcode. */

  if (list[1] == 0) return TRUE;
  }

/* Control never reaches here. There used to be a fail-save return FALSE; here,
but some compilers complain about an unreachable statement. */
}